

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O1

void do_ppu_mode2(Emulator *e)

{
  Obj *pOVar1;
  byte bVar2;
  u8 uVar3;
  u8 uVar4;
  u8 uVar5;
  undefined1 uVar6;
  u8 uVar7;
  ObjPriority OVar8;
  Bool BVar9;
  Bool BVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  Obj *pOVar14;
  bool bVar15;
  
  dma_synchronize(e);
  if (((e->state).ppu.lcdc.obj_display != FALSE) && ((e->config).disable_obj == FALSE)) {
    bVar2 = "\b\x10"[(e->state).ppu.lcdc.obj_size];
    uVar3 = (e->state).ppu.line_y;
    lVar11 = 0;
    uVar12 = 0;
    do {
      if ((byte)(uVar3 - (e->state).oam[lVar11].y) < bVar2) {
        pOVar1 = (e->state).oam + lVar11;
        uVar13 = (ulong)uVar12;
        if (0 < (int)uVar12 && (e->state).is_cgb == FALSE) {
          pOVar14 = (e->state).ppu.line_obj + ((ulong)uVar12 - 1);
          uVar13 = (ulong)uVar12;
          do {
            if (pOVar14->x <= pOVar1->x) goto LAB_0010c5a8;
            uVar4 = pOVar14->bank;
            uVar5 = pOVar14->cgb_palette;
            uVar6 = pOVar14->field_0x13;
            pOVar14[1].palette = pOVar14->palette;
            pOVar14[1].bank = uVar4;
            pOVar14[1].cgb_palette = uVar5;
            pOVar14[1].field_0x13 = uVar6;
            uVar4 = pOVar14->x;
            uVar5 = pOVar14->tile;
            uVar7 = pOVar14->byte3;
            OVar8 = pOVar14->priority;
            BVar9 = pOVar14->yflip;
            BVar10 = pOVar14->xflip;
            pOVar14[1].y = pOVar14->y;
            pOVar14[1].x = uVar4;
            pOVar14[1].tile = uVar5;
            pOVar14[1].byte3 = uVar7;
            pOVar14[1].priority = OVar8;
            pOVar14[1].yflip = BVar9;
            pOVar14[1].xflip = BVar10;
            pOVar14 = pOVar14 + -1;
            bVar15 = 1 < (long)uVar13;
            uVar13 = uVar13 - 1;
          } while (bVar15);
          uVar13 = 0;
        }
LAB_0010c5a8:
        uVar4 = pOVar1->bank;
        uVar5 = pOVar1->cgb_palette;
        uVar6 = pOVar1->field_0x13;
        pOVar14 = (e->state).ppu.line_obj + (int)uVar13;
        pOVar14->palette = pOVar1->palette;
        pOVar14->bank = uVar4;
        pOVar14->cgb_palette = uVar5;
        pOVar14->field_0x13 = uVar6;
        uVar4 = pOVar1->x;
        uVar5 = pOVar1->tile;
        uVar7 = pOVar1->byte3;
        OVar8 = pOVar1->priority;
        BVar9 = pOVar1->yflip;
        BVar10 = pOVar1->xflip;
        pOVar14 = (e->state).ppu.line_obj + (int)uVar13;
        pOVar14->y = pOVar1->y;
        pOVar14->x = uVar4;
        pOVar14->tile = uVar5;
        pOVar14->byte3 = uVar7;
        pOVar14->priority = OVar8;
        pOVar14->yflip = BVar9;
        pOVar14->xflip = BVar10;
        uVar12 = uVar12 + 1;
        bVar15 = uVar12 == 10;
      }
      else {
        bVar15 = false;
      }
    } while ((!bVar15) && (lVar11 = lVar11 + 1, lVar11 != 0x28));
    (e->state).ppu.line_obj_count = (u8)uVar12;
  }
  return;
}

Assistant:

static void do_ppu_mode2(Emulator* e) {
  dma_synchronize(e);
  if (!LCDC.obj_display || e->config.disable_obj) {
    return;
  }

  int line_obj_count = 0;
  int i;
  u8 obj_height = s_obj_size_to_height[LCDC.obj_size];
  u8 y = PPU.line_y;
  for (i = 0; i < OBJ_COUNT; ++i) {
    /* Put the visible sprites into line_obj. Insert them so sprites with
     * smaller X-coordinates are earlier, but only on DMG. On CGB, they are
     * always ordered by obj index. */
    Obj* o = &OAM[i];
    u8 rel_y = y - o->y;
    if (rel_y < obj_height) {
      int j = line_obj_count;
      if (!IS_CGB) {
        while (j > 0 && o->x < PPU.line_obj[j - 1].x) {
          PPU.line_obj[j] = PPU.line_obj[j - 1];
          j--;
        }
      }
      PPU.line_obj[j] = *o;
      if (++line_obj_count == OBJ_PER_LINE_COUNT) {
        break;
      }
    }
  }
  PPU.line_obj_count = line_obj_count;
}